

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# am_map.cpp
# Opt level: O0

void AM_drawWalls(bool allmap)

{
  bool bVar1;
  int iVar2;
  sector_t_conflict *psVar3;
  AMColor *pAVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  bool local_a9;
  int local_8c;
  AMColor local_88;
  AMColor c;
  undefined1 local_70 [24];
  undefined1 auStack_58 [7];
  bool portalmode;
  DVector2 offset;
  double local_40;
  undefined1 local_38 [28];
  int pg;
  int p;
  int numportalgroups;
  int color;
  int lock;
  int i;
  bool allmap_local;
  
  lock._3_1_ = allmap;
  bVar1 = FBoolCVar::operator_cast_to_bool(&am_portaloverlay);
  if (bVar1) {
    local_8c = Displacements.size;
  }
  else {
    local_8c = 0;
  }
  pg = local_8c;
  do {
    do {
      local_38._24_4_ = local_8c + -1;
      if ((int)local_38._24_4_ < -1) {
        return;
      }
      local_8c = local_38._24_4_;
    } while (local_38._24_4_ == MapPortalGroup);
    for (color = 0; local_8c = local_38._24_4_, color < numlines; color = color + 1) {
      if ((lines[color].sidedef[0]->Flags & 0x40) == 0) {
        local_38._20_4_ = (lines[color].frontsector)->PortalGroup;
      }
      else {
        dVar5 = vertex_t::fX(lines[color].v1);
        line_t::Delta((line_t *)local_38);
        dVar7 = (double)local_38._0_8_ / 2.0;
        dVar6 = vertex_t::fY(lines[color].v1);
        line_t::Delta((line_t *)&offset.Y);
        psVar3 = P_PointInSector(dVar5 + dVar7,dVar6 + local_40 / 2.0);
        local_38._20_4_ = psVar3->PortalGroup;
      }
      TVector2<double>::TVector2((TVector2<double> *)auStack_58);
      local_a9 = 0 < pg && local_38._20_4_ != MapPortalGroup;
      local_70[0x17] = local_a9;
      if (local_38._20_4_ == local_38._24_4_) {
        FDisplacementTable::getOffset((FDisplacementTable *)local_70,0x1af5e78,local_38._20_4_);
        TVector2<double>::operator=((TVector2<double> *)auStack_58,(TVector2<double> *)local_70);
LAB_0042d9b0:
        dVar5 = vertex_t::fX(lines[color].v1);
        AM_drawWalls::l.a.x = dVar5 + _auStack_58;
        dVar5 = vertex_t::fY(lines[color].v1);
        AM_drawWalls::l.a.y = dVar5 + offset.X;
        dVar5 = vertex_t::fX(lines[color].v2);
        AM_drawWalls::l.b.x = dVar5 + _auStack_58;
        dVar5 = vertex_t::fY(lines[color].v2);
        AM_drawWalls::l.b.y = dVar5 + offset.X;
        iVar2 = FIntCVar::operator_cast_to_int(&am_rotate);
        if ((iVar2 == 1) ||
           ((iVar2 = FIntCVar::operator_cast_to_int(&am_rotate), iVar2 == 2 &&
            ((viewactive & 1U) != 0)))) {
          AM_rotatePoint((double *)&AM_drawWalls::l,&AM_drawWalls::l.a.y);
          AM_rotatePoint(&AM_drawWalls::l.b.x,&AM_drawWalls::l.b.y);
        }
        iVar2 = FIntCVar::operator_cast_to_int(&am_cheat);
        if ((iVar2 == 0) && ((lines[color].flags & 0x100) == 0)) {
          if (((lock._3_1_ & 1) != 0) &&
             ((((lines[color].flags & 0x80) == 0 ||
               ((iVar2 = FIntCVar::operator_cast_to_int(&am_cheat), iVar2 != 0 &&
                (iVar2 = FIntCVar::operator_cast_to_int(&am_cheat), iVar2 < 4)))) ||
              (((am_showallenabled & 1U) != 0 && (bVar1 = CheckCheatmode(false), !bVar1)))))) {
            AM_drawMline(&AM_drawWalls::l,0x11);
          }
        }
        else if ((((lines[color].flags & 0x80) == 0) ||
                 ((iVar2 = FIntCVar::operator_cast_to_int(&am_cheat), iVar2 != 0 &&
                  (iVar2 = FIntCVar::operator_cast_to_int(&am_cheat), iVar2 < 4)))) ||
                (((am_showallenabled & 1U) != 0 && (bVar1 = CheckCheatmode(false), !bVar1)))) {
          if ((local_70[0x17] & 1) == 0) {
            bVar1 = AM_CheckSecret(lines + color);
            if (bVar1) {
              AM_drawMline(&AM_drawWalls::l,0x15);
            }
            else if ((lines[color].flags & 0x20) == 0) {
              bVar1 = AM_isTeleportBoundary(lines + color);
              if ((bVar1) && (bVar1 = AMColorset::isValid(&AMColors,0x13), bVar1)) {
                AM_drawMline(&AM_drawWalls::l,0x13);
              }
              else {
                bVar1 = AM_isExitBoundary(lines + color);
                if ((bVar1) && (bVar1 = AMColorset::isValid(&AMColors,0x14), bVar1)) {
                  AM_drawMline(&AM_drawWalls::l,0x14);
                }
                else {
                  bVar1 = AM_isLockBoundary(lines + color,&numportalgroups);
                  if (bVar1) {
                    if ((AMColors.displayLocks & 1U) == 0) {
                      AM_drawMline(&AM_drawWalls::l,0x12);
                    }
                    else {
                      p = P_GetMapColorForLock(numportalgroups);
                      if (p < 0) {
                        pAVar4 = AMColorset::operator[](&AMColors,0x12);
                        local_88 = *pAVar4;
                      }
                      else {
                        AMColor::FromRGB(&local_88,p >> 0x10 & 0xff,p >> 8 & 0xff,p & 0xff);
                      }
                      AM_drawMline(&AM_drawWalls::l,&local_88);
                    }
                  }
                  else {
                    bVar1 = FBoolCVar::operator_cast_to_bool(&am_showtriggerlines);
                    if (((bVar1) && (bVar1 = AMColorset::isValid(&AMColors,0xd), bVar1)) &&
                       (bVar1 = AM_isTriggerBoundary(lines + color), bVar1)) {
                      AM_drawMline(&AM_drawWalls::l,0xd);
                    }
                    else if (lines[color].backsector == (sector_t_conflict *)0x0) {
                      AM_drawMline(&AM_drawWalls::l,2);
                    }
                    else {
                      bVar1 = secplane_t::operator!=
                                        (&(lines[color].backsector)->floorplane,
                                         &(lines[color].frontsector)->floorplane);
                      if (bVar1) {
                        AM_drawMline(&AM_drawWalls::l,4);
                      }
                      else {
                        bVar1 = secplane_t::operator!=
                                          (&(lines[color].backsector)->ceilingplane,
                                           &(lines[color].frontsector)->ceilingplane);
                        if (bVar1) {
                          AM_drawMline(&AM_drawWalls::l,5);
                        }
                        else {
                          bVar1 = AM_Check3DFloors(lines + color);
                          if (bVar1) {
                            AM_drawMline(&AM_drawWalls::l,6);
                          }
                          else {
                            iVar2 = FIntCVar::operator_cast_to_int(&am_cheat);
                            if ((0 < iVar2) &&
                               (iVar2 = FIntCVar::operator_cast_to_int(&am_cheat), iVar2 < 4)) {
                              AM_drawMline(&AM_drawWalls::l,3);
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
            else {
              iVar2 = FIntCVar::operator_cast_to_int(&am_cheat);
              if ((iVar2 == 0) || (lines[color].backsector == (sector_t_conflict *)0x0)) {
                AM_drawMline(&AM_drawWalls::l,2);
              }
              else {
                AM_drawMline(&AM_drawWalls::l,0xe);
              }
            }
          }
          else {
            AM_drawMline(&AM_drawWalls::l,0x16);
          }
        }
      }
      else if ((local_38._24_4_ == -1) &&
              ((local_38._20_4_ == MapPortalGroup ||
               (bVar1 = FBoolCVar::operator_cast_to_bool(&am_portaloverlay), !bVar1)))) {
        TVector2<double>::TVector2((TVector2<double> *)&c,0.0,0.0);
        TVector2<double>::operator=((TVector2<double> *)auStack_58,(TVector2<double> *)&c);
        goto LAB_0042d9b0;
      }
    }
  } while( true );
}

Assistant:

void AM_drawWalls (bool allmap)
{
	int i;
	static mline_t l;
	int lock, color;

	int numportalgroups = am_portaloverlay ? Displacements.size : 0;

	for (int p = numportalgroups - 1; p >= -1; p--)
	{
		if (p == MapPortalGroup) continue;


		for (i = 0; i < numlines; i++)
		{
			int pg;
			
			if (lines[i].sidedef[0]->Flags & WALLF_POLYOBJ)
			{
				// For polyobjects we must test the surrounding sector to get the proper group.
				pg = P_PointInSector(lines[i].v1->fX() + lines[i].Delta().X / 2, lines[i].v1->fY() + lines[i].Delta().Y / 2)->PortalGroup;
			}
			else
			{
				pg = lines[i].frontsector->PortalGroup;
			}
			DVector2 offset;
			bool portalmode = numportalgroups > 0 &&  pg != MapPortalGroup;
			if (pg == p)
			{
				offset = Displacements.getOffset(pg, MapPortalGroup);
			}
			else if (p == -1 && (pg == MapPortalGroup || !am_portaloverlay))
			{
				offset = { 0, 0 };
			}
			else continue;

			l.a.x = (lines[i].v1->fX() + offset.X);
			l.a.y = (lines[i].v1->fY() + offset.Y);
			l.b.x = (lines[i].v2->fX() + offset.X);
			l.b.y = (lines[i].v2->fY() + offset.Y);

			if (am_rotate == 1 || (am_rotate == 2 && viewactive))
			{
				AM_rotatePoint(&l.a.x, &l.a.y);
				AM_rotatePoint(&l.b.x, &l.b.y);
			}

			if (am_cheat != 0 || (lines[i].flags & ML_MAPPED))
			{
				if ((lines[i].flags & ML_DONTDRAW) && (am_cheat == 0 || am_cheat >= 4))
				{
					if (!am_showallenabled || CheckCheatmode(false))
					{
						continue;
					}
				}

				if (portalmode)
				{
					AM_drawMline(&l, AMColors.PortalColor);
				}
				else if (AM_CheckSecret(&lines[i]))
				{
					// map secret sectors like Boom
					AM_drawMline(&l, AMColors.SecretSectorColor);
				}
				else if (lines[i].flags & ML_SECRET)
				{ // secret door
					if (am_cheat != 0 && lines[i].backsector != NULL)
						AM_drawMline(&l, AMColors.SecretWallColor);
					else
						AM_drawMline(&l, AMColors.WallColor);
				}
				else if (AM_isTeleportBoundary(lines[i]) && AMColors.isValid(AMColors.IntraTeleportColor))
				{ // intra-level teleporters
					AM_drawMline(&l, AMColors.IntraTeleportColor);
				}
				else if (AM_isExitBoundary(lines[i]) && AMColors.isValid(AMColors.InterTeleportColor))
				{ // inter-level/game-ending teleporters
					AM_drawMline(&l, AMColors.InterTeleportColor);
				}
				else if (AM_isLockBoundary(lines[i], &lock))
				{
					if (AMColors.displayLocks)
					{
						color = P_GetMapColorForLock(lock);

						AMColor c;

						if (color >= 0)	c.FromRGB(RPART(color), GPART(color), BPART(color));
						else c = AMColors[AMColors.LockedColor];

						AM_drawMline(&l, c);
					}
					else
					{
						AM_drawMline(&l, AMColors.LockedColor);  // locked special
					}
				}
				else if (am_showtriggerlines
					&& AMColors.isValid(AMColors.SpecialWallColor)
					&& AM_isTriggerBoundary(lines[i]))
				{
					AM_drawMline(&l, AMColors.SpecialWallColor);	// wall with special non-door action the player can do
				}
				else if (lines[i].backsector == NULL)
				{
					AM_drawMline(&l, AMColors.WallColor);	// one-sided wall
				}
				else if (lines[i].backsector->floorplane
					!= lines[i].frontsector->floorplane)
				{
					AM_drawMline(&l, AMColors.FDWallColor); // floor level change
				}
				else if (lines[i].backsector->ceilingplane
					!= lines[i].frontsector->ceilingplane)
				{
					AM_drawMline(&l, AMColors.CDWallColor); // ceiling level change
				}
				else if (AM_Check3DFloors(&lines[i]))
				{
					AM_drawMline(&l, AMColors.EFWallColor); // Extra floor border
				}
				else if (am_cheat > 0 && am_cheat < 4)
				{
					AM_drawMline(&l, AMColors.TSWallColor);
				}
			}
			else if (allmap)
			{
				if ((lines[i].flags & ML_DONTDRAW) && (am_cheat == 0 || am_cheat >= 4))
				{
					if (!am_showallenabled || CheckCheatmode(false))
					{
						continue;
					}
				}
				AM_drawMline(&l, AMColors.NotSeenColor);
			}
		}
	}
}